

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

StringTree * capnp::compiler::stringLiteral(StringTree *__return_storage_ptr__,StringPtr chars)

{
  size_t in_RCX;
  char *in_R8;
  ArrayPtr<const_unsigned_char> bytes;
  undefined1 local_3a;
  kj local_39;
  Array<char> local_38;
  
  local_39 = (kj)0x22;
  bytes.ptr = (uchar *)(chars.content.size_ - 1);
  bytes.size_ = in_RCX;
  kj::encodeCEscape((String *)&local_38,(kj *)chars.content.ptr,bytes);
  local_3a = 0x22;
  kj::strTree<char,kj::String,char>
            (__return_storage_ptr__,&local_39,(char *)&local_38,(String *)&local_3a,in_R8);
  kj::Array<char>::~Array(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree stringLiteral(kj::StringPtr chars) {
  return kj::strTree('"', kj::encodeCEscape(chars), '"');
}